

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,optional<wasm::Name> label,HeapType type)

{
  Name label_00;
  uint pos_00;
  bool bVar1;
  ulong pos_01;
  Name *pNVar2;
  Signature sig;
  Name local_c0;
  Result<wasm::Ok> local_b0;
  allocator<char> local_71;
  string local_70;
  Err local_50;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_30;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_20;
  Index pos_local;
  ParseDefsCtx *this_local;
  HeapType type_local;
  
  local_30 = annotations;
  annotations_local._4_4_ = pos;
  pPStack_20 = this;
  this_local = (ParseDefsCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  pos_00 = annotations_local._4_4_;
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&label);
    if (bVar1) {
      pNVar2 = std::optional<wasm::Name>::operator*(&label);
      local_c0.super_IString.str._M_len = (pNVar2->super_IString).str._M_len;
      local_c0.super_IString.str._M_str = (pNVar2->super_IString).str._M_str;
    }
    else {
      wasm::Name::Name(&local_c0);
    }
    sig = HeapType::getSignature((HeapType *)&this_local);
    label_00.super_IString.str._M_str = local_c0.super_IString.str._M_str;
    label_00.super_IString.str._M_len = local_c0.super_IString.str._M_len;
    IRBuilder::makeBlock(&local_b0,&this->irBuilder,label_00,sig);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos_00,&local_b0);
    Result<wasm::Ok>::~Result(&local_b0);
  }
  else {
    pos_01 = (ulong)annotations_local._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"expected function type",&local_71);
    Lexer::err(&local_50,&this->in,pos_01,&local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBlock(Index pos,
                     const std::vector<Annotation>& annotations,
                     std::optional<Name> label,
                     HeapType type) {
    // TODO: validate labels?
    // TODO: Move error on input types to here?
    if (!type.isSignature()) {
      return in.err(pos, "expected function type");
    }
    return withLoc(
      pos, irBuilder.makeBlock(label ? *label : Name{}, type.getSignature()));
  }